

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

Scalar cnn::logdet<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                 (Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *M,
                 bool use_cholesky)

{
  ulong uVar1;
  Index IVar2;
  MatrixType *pMVar3;
  PartialPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this;
  CoeffReturnType pfVar4;
  byte in_SIL;
  int __x;
  Scalar SVar5;
  double dVar6;
  float *lii;
  uint i_1;
  Scalar c;
  MatrixType *LU;
  PartialPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> lu;
  uint i;
  TriangularView<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1U> *U;
  LLT<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1> chol;
  Scalar ld;
  PartialPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffff10;
  LLT<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1> *in_stack_ffffffffffffff18;
  TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1U>_>
  *in_stack_ffffffffffffff20;
  undefined1 *col;
  MatrixType *row;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  EigenBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff38;
  EigenBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff48;
  PartialPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffff50;
  uint local_a8;
  float local_a4;
  undefined1 local_98 [56];
  PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *in_stack_ffffffffffffffa0;
  uint local_58;
  MatrixTypeNested local_48;
  MatrixTypeNested *local_40;
  LLT<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1> local_38;
  float local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_10 = 0.0;
  if (local_9 == 0) {
    col = local_98;
    Eigen::PartialPivLU<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
    PartialPivLU<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    pMVar3 = Eigen::PartialPivLU<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::matrixLU
                       (in_stack_ffffffffffffff10);
    row = pMVar3;
    Eigen::PartialPivLU<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::permutationP
              (in_stack_ffffffffffffff10);
    IVar2 = Eigen::PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::determinant
                      (in_stack_ffffffffffffffa0);
    local_a4 = (float)IVar2;
    local_a8 = 0;
    while( true ) {
      this = (PartialPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)(ulong)local_a8;
      IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)0x4caa98);
      if (IVar2 <= (long)this) break;
      __x = (int)pMVar3;
      pfVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0> *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),(Index)row,
                          (Index)col);
      if (*pfVar4 < 0.0) {
        local_a4 = local_a4 * -1.0;
      }
      dVar6 = (double)(ulong)(uint)*pfVar4;
      std::abs(__x);
      dVar6 = std::log(dVar6);
      local_10 = SUB84(dVar6,0) + local_10;
      local_a8 = local_a8 + 1;
    }
    dVar6 = std::log((double)(ulong)(uint)local_a4);
    local_10 = SUB84(dVar6,0) + local_10;
    Eigen::PartialPivLU<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~PartialPivLU(this);
  }
  else {
    Eigen::LLT<Eigen::Matrix<float,-1,-1,0,-1,-1>,1>::
    LLT<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
              (&local_38,in_stack_ffffffffffffff38);
    local_48 = (MatrixTypeNested)
               Eigen::LLT<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1>::matrixL
                         (in_stack_ffffffffffffff18);
    local_40 = &local_48;
    local_58 = 0;
    while( true ) {
      uVar1 = (ulong)local_58;
      IVar2 = Eigen::
              MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ::rows((MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      *)in_stack_ffffffffffffff10);
      if (IVar2 <= (long)uVar1) break;
      SVar5 = Eigen::
              TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1U>_>
              ::operator()(in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18,
                           (Index)in_stack_ffffffffffffff10);
      dVar6 = std::log((double)(ulong)(uint)SVar5);
      local_10 = SUB84(dVar6,0) + local_10;
      local_58 = local_58 + 1;
    }
    local_10 = local_10 * 2.0;
    Eigen::LLT<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1>::~LLT
              ((LLT<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1> *)in_stack_ffffffffffffff10);
  }
  return local_10;
}

Assistant:

inline typename MatrixType::Scalar logdet(const MatrixType& M, bool use_cholesky = false) {
  using namespace Eigen;
  using std::log;
  typedef typename MatrixType::Scalar Scalar;
  Scalar ld = 0;
  if (use_cholesky) {
    LLT<Matrix<Scalar,Dynamic,Dynamic>> chol(M);
    auto& U = chol.matrixL();
    for (unsigned i = 0; i < M.rows(); ++i)
      ld += log(U(i,i));
    ld *= 2;
  } else {
    PartialPivLU<Matrix<Scalar,Dynamic,Dynamic>> lu(M);
    auto& LU = lu.matrixLU();
    Scalar c = lu.permutationP().determinant(); // -1 or 1
    for (unsigned i = 0; i < LU.rows(); ++i) {
      const auto& lii = LU(i,i);
      if (lii < Scalar(0)) c *= -1;
      ld += log(abs(lii));
    }
    ld += log(c);
  }
  return ld;
}